

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O2

void __thiscall
sigslot::
_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::slot_disconnect(_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                  *this,has_slots<sigslot::multi_threaded_local> *pslot)

{
  const_iterator cVar1;
  has_slots<sigslot::multi_threaded_local> *phVar2;
  const_iterator __position;
  lock_block<sigslot::multi_threaded_local> lock;
  lock_block<sigslot::multi_threaded_local> local_28;
  
  local_28.m_mutex = (multi_threaded_local *)this;
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  cVar1._M_node =
       (this->m_connected_slots).
       super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  while (__position._M_node = cVar1._M_node,
        __position._M_node != (_List_node_base *)&this->m_connected_slots) {
    cVar1._M_node = (__position._M_node)->_M_next;
    phVar2 = (has_slots<sigslot::multi_threaded_local> *)
             (*(code *)(__position._M_node[1]._M_next)->_M_next[1]._M_next)();
    if (phVar2 == pslot) {
      if (__position._M_node[1]._M_next != (_List_node_base *)0x0) {
        (*(code *)(__position._M_node[1]._M_next)->_M_next->_M_prev)();
      }
      std::__cxx11::
      list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
      ::erase(&this->m_connected_slots,__position);
    }
  }
  lock_block<sigslot::multi_threaded_local>::~lock_block(&local_28);
  return;
}

Assistant:

void slot_disconnect(has_slots<mt_policy>* pslot)
		{
			lock_block<mt_policy> lock(this);
			iterator it = m_connected_slots.begin();
			iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				iterator itNext = it;
				++itNext;

				if((*it)->getdest() == pslot)
				{
					delete *it;
					m_connected_slots.erase(it);
				}

				it = itNext;
			}
		}